

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

_Bool sysbvm_jit_emitObjectFileProgramEntityRecursiveName
                (sysbvm_bytecodeJit_t *jit,sysbvm_programEntity_t *programEntity)

{
  _Bool _Var1;
  size_t entryCount;
  bool local_31;
  size_t byteSize;
  char dot;
  sysbvm_programEntity_t *psStack_20;
  _Bool hasEmittedName;
  sysbvm_programEntity_t *programEntity_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  if (programEntity == (sysbvm_programEntity_t *)0x0) {
    jit_local._7_1_ = false;
  }
  else {
    psStack_20 = programEntity;
    programEntity_local = (sysbvm_programEntity_t *)jit;
    byteSize._7_1_ =
         sysbvm_jit_emitObjectFileProgramEntityRecursiveName
                   (jit,(sysbvm_programEntity_t *)programEntity->owner);
    _Var1 = sysbvm_tuple_isBytes(psStack_20->name);
    if (_Var1) {
      if ((byteSize._7_1_ & 1) != 0) {
        byteSize._6_1_ = 0x2e;
        sysbvm_dynarray_add((sysbvm_dynarray_t *)&programEntity_local[0x14].serialToken,
                            (void *)((long)&byteSize + 6));
      }
      entryCount = sysbvm_tuple_getSizeInBytes(psStack_20->name);
      sysbvm_dynarray_addAll
                ((sysbvm_dynarray_t *)&programEntity_local[0x14].serialToken,entryCount,
                 (void *)(psStack_20->name + 0x10));
      local_31 = (byteSize._7_1_ & 1) != 0 || entryCount != 0;
      byteSize._7_1_ = local_31;
    }
    jit_local._7_1_ = (_Bool)(byteSize._7_1_ & 1);
  }
  return jit_local._7_1_;
}

Assistant:

static bool sysbvm_jit_emitObjectFileProgramEntityRecursiveName(sysbvm_bytecodeJit_t *jit, sysbvm_programEntity_t *programEntity)
{
    if(!programEntity)
        return false;

    bool hasEmittedName = sysbvm_jit_emitObjectFileProgramEntityRecursiveName(jit, (sysbvm_programEntity_t*)programEntity->owner);
    if(sysbvm_tuple_isBytes(programEntity->name))
    {
        if(hasEmittedName)
        {
            char dot = '.';
            sysbvm_dynarray_add(&jit->objectFileContent, &dot);
        }
        size_t byteSize = sysbvm_tuple_getSizeInBytes(programEntity->name);
        sysbvm_dynarray_addAll(&jit->objectFileContent, byteSize, SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(programEntity->name)->bytes);
        hasEmittedName = hasEmittedName || byteSize > 0;
    }

    return hasEmittedName;
}